

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void __thiscall
DensityCalculator<double,_float>::push_bdens_fast_route
          (DensityCalculator<double,_float> *this,double split_point,size_t col)

{
  double dVar1;
  double *pdVar2;
  iterator iVar3;
  double dVar4;
  double dVar5;
  double local_28;
  double local_20;
  
  dVar1 = (this->box_high).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar4 = (this->box_low).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar5 = dVar1 - dVar4;
  dVar4 = (split_point - dVar4) / dVar5;
  dVar5 = (dVar1 - split_point) / dVar5;
  if (dVar4 <= 2.2250738585072014e-308) {
    dVar4 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar4) {
    dVar4 = 0.9999999999999998;
  }
  dVar4 = log(dVar4);
  iVar3._M_current =
       (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  dVar1 = iVar3._M_current[-1];
  dVar4 = dVar4 + dVar1;
  if (dVar5 <= 2.2250738585072014e-308) {
    dVar5 = 2.2250738585072014e-308;
  }
  if (0.9999999999999998 <= dVar5) {
    dVar5 = 0.9999999999999998;
  }
  local_20 = dVar4;
  local_28 = log(dVar5);
  local_28 = local_28 + dVar1;
  pdVar2 = (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (iVar3._M_current == pdVar2) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this,iVar3,&local_28);
    iVar3._M_current =
         (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar2 = (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar3._M_current = local_28;
    iVar3._M_current = iVar3._M_current + 1;
    (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current;
  }
  if (iVar3._M_current == pdVar2) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)this,iVar3,&local_20);
  }
  else {
    *iVar3._M_current = dVar4;
    (this->multipliers).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  push_bdens_internal(this,split_point,col);
  return;
}

Assistant:

void DensityCalculator<ldouble_safe, real_t>::push_bdens_fast_route(double split_point, size_t col)
{
    ldouble_safe curr_range = (ldouble_safe)this->box_high[col] - (ldouble_safe)this->box_low[col];
    ldouble_safe fraction_left  =  ((ldouble_safe)split_point - (ldouble_safe)this->box_low[col]) / curr_range;
    ldouble_safe fraction_right = ((ldouble_safe)this->box_high[col] - (ldouble_safe)split_point) / curr_range;
    fraction_left   = std::fmax(fraction_left, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_left   = std::fmin(fraction_left, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_left   = std::log(fraction_left);
    fraction_left  += this->multipliers.back();
    fraction_right  = std::fmax(fraction_right, (ldouble_safe)std::numeric_limits<double>::min());
    fraction_right  = std::fmin(fraction_right, (ldouble_safe)(1. - std::numeric_limits<double>::epsilon()));
    fraction_right  = std::log(fraction_right);
    fraction_right += this->multipliers.back();
    this->multipliers.push_back(fraction_right);
    this->multipliers.push_back(fraction_left);

    this->push_bdens_internal(split_point, col);
}